

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void luaL_unref(lua_State *L,int t,int ref)

{
  int idx;
  int ref_local;
  int t_local;
  lua_State *L_local;
  
  if (-1 < ref) {
    idx = lua_absindex(L,t);
    lua_rawgeti(L,idx,3);
    lua_rawseti(L,idx,(long)ref);
    lua_pushinteger(L,(long)ref);
    lua_rawseti(L,idx,3);
  }
  return;
}

Assistant:

LUALIB_API void luaL_unref (lua_State *L, int t, int ref) {
  if (ref >= 0) {
    t = lua_absindex(L, t);
    lua_rawgeti(L, t, freelist);
    lua_assert(lua_isinteger(L, -1));
    lua_rawseti(L, t, ref);  /* t[ref] = t[freelist] */
    lua_pushinteger(L, ref);
    lua_rawseti(L, t, freelist);  /* t[freelist] = ref */
  }
}